

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

bool NULLCError::try_0(NULLCRef function,NULLCArray *message,NULLCRef *exception,NULLCRef *result)

{
  nullres nVar1;
  ExternTypeInfo *pEVar2;
  char *__s;
  size_t sVar3;
  NULLCArray NVar4;
  undefined8 local_98;
  undefined4 local_90;
  undefined8 local_8c;
  undefined4 local_84;
  char *local_80;
  uint local_78;
  uint rawLength;
  char *rawMessage;
  NULLCFuncPtr functionValue;
  ExternTypeInfo *exTypes;
  NULLCRef *result_local;
  NULLCRef *exception_local;
  NULLCArray *message_local;
  
  if (function.ptr == (char *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    message_local._7_1_ = false;
  }
  else {
    pEVar2 = nullcDebugTypeInfo((uint *)0x0);
    if (pEVar2[function.typeID].subCat == CAT_FUNCTION) {
      if (pEVar2[function.typeID].field_8.arrSize < 2) {
        nVar1 = nullcCallFunction(*(undefined8 *)function.ptr,(ulong)*(uint *)(function.ptr + 8));
        if (nVar1 == '\0') {
          if (message != (NULLCArray *)0x0) {
            __s = nullcGetLastError();
            sVar3 = strlen(__s);
            NVar4 = nullcAllocateArrayTyped(2,(int)sVar3 + 1);
            local_80 = NVar4.ptr;
            local_78 = NVar4.len;
            message->ptr = local_80;
            message->len = local_78;
            strcpy(message->ptr,__s);
          }
          nullcGetLastErrorObject();
          *(undefined8 *)exception = local_8c;
          *(undefined4 *)((long)&exception->ptr + 4) = local_84;
          nullcClearError();
          message_local._7_1_ = false;
        }
        else {
          if (result != (NULLCRef *)0x0) {
            nullcGetResultObject();
            *(undefined8 *)result = local_98;
            *(undefined4 *)((long)&result->ptr + 4) = local_90;
          }
          message_local._7_1_ = true;
        }
      }
      else {
        nullcThrowError("ERROR: can\'t call function with arguments");
        message_local._7_1_ = false;
      }
    }
    else {
      nullcThrowError("ERROR: argument is not a function");
      message_local._7_1_ = false;
    }
  }
  return message_local._7_1_;
}

Assistant:

bool try_0(NULLCRef function, NULLCArray* message, NULLCRef* exception, NULLCRef* result)
	{
		if(!function.ptr)
		{
			nullcThrowError("ERROR: null pointer access");
			return false;
		}

		ExternTypeInfo *exTypes = nullcDebugTypeInfo(NULL);

		if(exTypes[function.typeID].subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("ERROR: argument is not a function");
			return false;
		}

		if(exTypes[function.typeID].memberCount > 1)
		{
			nullcThrowError("ERROR: can't call function with arguments");
			return false;
		}

		NULLCFuncPtr functionValue = *(NULLCFuncPtr*)function.ptr;

		if(!nullcCallFunction(functionValue))
		{
			if(message)
			{
				const char *rawMessage = nullcGetLastError();
				unsigned rawLength = unsigned(strlen(rawMessage));

				*message = nullcAllocateArrayTyped(NULLC_TYPE_CHAR, rawLength + 1);
				strcpy(message->ptr, rawMessage);
			}

			*exception = nullcGetLastErrorObject();

			nullcClearError();
			return false;
		}

		if(result)
			*result = nullcGetResultObject();

		return true;
	}